

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O2

bool G_CheckSpot(int playernum,FPlayerStart *mthing)

{
  uint *puVar1;
  double dVar2;
  AActor *thing;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  DWORD DVar7;
  bool bVar8;
  sector_t *psVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  DVector2 local_38;
  DVector2 local_28;
  
  DVar7 = level.flags;
  if (mthing->type == 0) {
    return false;
  }
  dVar2 = (mthing->pos).Z;
  dVar5 = (mthing->pos).X;
  dVar6 = (mthing->pos).Y;
  local_38.X = dVar5;
  local_38.Y = dVar6;
  psVar9 = P_PointInSector(&local_38);
  local_28.X = dVar5;
  local_28.Y = dVar6;
  dVar4 = secplane_t::ZatPoint(&psVar9->floorplane,&local_28);
  thing = (AActor *)(&players)[(long)playernum * 0x54];
  if (thing == (AActor *)0x0) {
    uVar10 = 0;
    uVar11 = (ulong)(uint)playernum;
    if (playernum < 1) {
      uVar11 = uVar10;
    }
    for (; bVar8 = uVar11 * 0x2a0 - uVar10 == 0, !bVar8; uVar10 = uVar10 + 0x2a0) {
      lVar3 = *(long *)((long)&players + uVar10);
      if (lVar3 != 0) {
        if ((*(double *)(lVar3 + 0x48) == dVar5) && (!NAN(*(double *)(lVar3 + 0x48)) && !NAN(dVar5))
           ) {
          if ((*(double *)(lVar3 + 0x50) == dVar6) &&
             (!NAN(*(double *)(lVar3 + 0x50)) && !NAN(dVar6))) {
            return bVar8;
          }
        }
      }
    }
  }
  else {
    dVar12 = 0.0;
    if ((DVar7 >> 0x1b & 1) != 0) {
      dVar12 = dVar2;
    }
    dVar2 = (thing->__Pos).Z;
    (thing->__Pos).Z = dVar12 + dVar4;
    *(byte *)&(thing->flags).Value = (byte)(thing->flags).Value | 2;
    local_38.X = dVar5;
    local_38.Y = dVar6;
    bVar8 = P_CheckPosition(thing,&local_38,false);
    lVar3 = (&players)[(long)playernum * 0x54];
    puVar1 = (uint *)(lVar3 + 0x18c);
    *puVar1 = *puVar1 & 0xfffffffd;
    *(double *)(lVar3 + 0x58) = dVar2;
  }
  return bVar8;
}

Assistant:

bool G_CheckSpot (int playernum, FPlayerStart *mthing)
{
	DVector3 spot;
	double oldz;
	int i;

	if (mthing->type == 0) return false;

	spot = mthing->pos;

	if (!(level.flags & LEVEL_USEPLAYERSTARTZ))
	{
		spot.Z = 0;
	}
	spot.Z += P_PointInSector (spot)->floorplane.ZatPoint (spot);

	if (!players[playernum].mo)
	{ // first spawn of level, before corpses
		for (i = 0; i < playernum; i++)
			if (players[i].mo && players[i].mo->X() == spot.X && players[i].mo->Y() == spot.Y)
				return false;
		return true;
	}

	oldz = players[playernum].mo->Z();	// [RH] Need to save corpse's z-height
	players[playernum].mo->SetZ(spot.Z);		// [RH] Checks are now full 3-D

	// killough 4/2/98: fix bug where P_CheckPosition() uses a non-solid
	// corpse to detect collisions with other players in DM starts
	//
	// Old code:
	// if (!P_CheckPosition (players[playernum].mo, x, y))
	//    return false;

	players[playernum].mo->flags |=  MF_SOLID;
	i = P_CheckPosition(players[playernum].mo, spot);
	players[playernum].mo->flags &= ~MF_SOLID;
	players[playernum].mo->SetZ(oldz);	// [RH] Restore corpse's height
	if (!i)
		return false;

	return true;
}